

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict_manager.cpp
# Opt level: O2

Vector * __thiscall duckdb::ConflictManager::InternalRowIds(ConflictManager *this)

{
  _Head_base<0UL,_duckdb::Vector_*,_false> __p;
  pointer in_RAX;
  type pVVar1;
  _Head_base<0UL,_duckdb::Vector_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  if ((this->row_ids).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
      super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl == (Vector *)0x0) {
    make_uniq<duckdb::Vector,duckdb::LogicalTypeId_const&,unsigned_long&>
              ((duckdb *)&local_18,&LogicalType::ROW_TYPE,&this->input_size);
    __p._M_head_impl = local_18._M_head_impl;
    local_18._M_head_impl = (pointer)0x0;
    ::std::__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::reset
              ((__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)
               &this->row_ids,__p._M_head_impl);
    ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
              ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)&local_18);
  }
  pVVar1 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                     (&this->row_ids);
  return pVVar1;
}

Assistant:

Vector &ConflictManager::InternalRowIds() {
	if (!row_ids) {
		row_ids = make_uniq<Vector>(LogicalType::ROW_TYPE, input_size);
	}
	return *row_ids;
}